

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseIntermission(FMapInfoParser *this)

{
  bool bVar1;
  FIntermissionDescriptor *this_00;
  FName local_30 [4];
  FIntermissionDescriptor *local_20;
  FIntermissionDescriptor *desc;
  FMapInfoParser *pFStack_10;
  FName intname;
  FMapInfoParser *this_local;
  
  pFStack_10 = this;
  FScanner::MustGetString(&this->sc);
  FName::FName((FName *)((long)&desc + 4),(this->sc).String);
  this_00 = (FIntermissionDescriptor *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  (this_00->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array =
       (FIntermissionAction **)0x0;
  (this_00->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Most = 0;
  (this_00->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count = 0;
  FIntermissionDescriptor::FIntermissionDescriptor(this_00);
  local_20 = this_00;
  FName::FName(local_30,(FName *)((long)&desc + 4));
  ReplaceIntermission(local_30,local_20);
  FScanner::MustGetToken(&this->sc,0x7b);
  while( true ) {
    bVar1 = FScanner::CheckToken(&this->sc,0x7d);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ParseIntermissionAction(this,local_20);
  }
  return;
}

Assistant:

void FMapInfoParser::ParseIntermission()
{
	sc.MustGetString();
	FName intname = sc.String;
	FIntermissionDescriptor *desc = new FIntermissionDescriptor();

	ReplaceIntermission(intname, desc);
	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		ParseIntermissionAction(desc);
	}
}